

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

size_t mz_zip_file_read_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  __off64_t _Var2;
  size_t sVar3;
  long __off;
  
  _Var2 = ftello64(*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70));
  __off = file_ofs + *(long *)(*(long *)((long)pOpaque + 0x68) + 0x78);
  if (__off < 0) {
    return 0;
  }
  if ((_Var2 != __off) &&
     (iVar1 = fseeko64(*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70),__off,0), iVar1 != 0)) {
    return 0;
  }
  sVar3 = fread(pBuf,1,n,*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70));
  return sVar3;
}

Assistant:

static size_t mz_zip_file_read_func(void *pOpaque, mz_uint64 file_ofs, void *pBuf, size_t n)
{
    mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
    mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);

    file_ofs += pZip->m_pState->m_file_archive_start_ofs;

    if (((mz_int64)file_ofs < 0) || (((cur_ofs != (mz_int64)file_ofs)) && (MZ_FSEEK64(pZip->m_pState->m_pFile, (mz_int64)file_ofs, SEEK_SET))))
        return 0;

    return MZ_FREAD(pBuf, 1, n, pZip->m_pState->m_pFile);
}